

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# formatter.cpp
# Opt level: O2

void jsonnet::internal::fodder_fill
               (ostream *o,Fodder *fodder,bool space_before,bool separate_token,bool final)

{
  Kind KVar1;
  pointer pbVar2;
  bool bVar3;
  ostream *poVar4;
  undefined7 in_register_00000009;
  pointer pFVar5;
  undefined3 in_register_00000081;
  undefined4 uVar6;
  string *l;
  pointer pbVar7;
  uint uVar8;
  bool bVar9;
  undefined1 *local_70 [2];
  undefined1 local_60 [16];
  undefined4 local_50;
  undefined4 local_4c;
  long local_48;
  Fodder *local_40;
  pointer local_38;
  
  uVar6 = CONCAT31(in_register_00000081,final);
  local_50 = (undefined4)CONCAT71(in_register_00000009,separate_token);
  pFVar5 = (fodder->
           super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
           )._M_impl.super__Vector_impl_data._M_start;
  local_38 = (fodder->
             super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
             )._M_impl.super__Vector_impl_data._M_finish;
  local_48 = 0;
  uVar8 = 0;
  local_4c = uVar6;
  local_40 = fodder;
  do {
    if (pFVar5 == local_38) {
      if (((char)local_50 != '\0') && ((space_before & 1U) != 0)) {
        std::operator<<(o,' ');
      }
      return;
    }
    if ((char)uVar6 == '\0') {
      bVar9 = false;
    }
    else {
      bVar9 = local_48 ==
              ((long)(fodder->
                     super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                     )._M_impl.super__Vector_impl_data._M_finish -
              (long)(fodder->
                    super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                    )._M_impl.super__Vector_impl_data._M_start) / 0x28 + -1;
    }
    KVar1 = pFVar5->kind;
    if (KVar1 == PARAGRAPH) {
      pbVar2 = (pFVar5->comment).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      bVar3 = true;
      for (pbVar7 = (pFVar5->comment).
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start; fodder = local_40, uVar6 = local_4c,
          pbVar7 != pbVar2; pbVar7 = pbVar7 + 1) {
        if (pbVar7->_M_string_length != 0) {
          if (!bVar3) {
            local_70[0] = local_60;
            std::__cxx11::string::_M_construct((ulong)local_70,(char)uVar8);
            std::operator<<(o,(string *)local_70);
            std::__cxx11::string::~string((string *)local_70);
          }
          std::operator<<(o,(string *)pbVar7);
        }
        std::operator<<(o,'\n');
        bVar3 = false;
      }
      if (!bVar9) {
        local_70[0] = local_60;
        std::__cxx11::string::_M_construct((ulong)local_70,(char)pFVar5->blanks);
        std::operator<<(o,(string *)local_70);
        std::__cxx11::string::~string((string *)local_70);
        local_70[0] = local_60;
        std::__cxx11::string::_M_construct((ulong)local_70,(char)pFVar5->indent);
        std::operator<<(o,(string *)local_70);
LAB_001a72a0:
        std::__cxx11::string::~string((string *)local_70);
      }
LAB_001a72a8:
      uVar8 = pFVar5->indent;
      space_before = false;
    }
    else if (KVar1 == INTERSTITIAL) {
      if ((space_before & 1U) != 0) {
        std::operator<<(o,' ');
      }
      std::operator<<(o,(string *)
                        (pFVar5->comment).
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start);
      space_before = true;
    }
    else if (KVar1 == LINE_END) {
      if ((pFVar5->comment).
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish !=
          (pFVar5->comment).
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start) {
        poVar4 = std::operator<<(o,"  ");
        std::operator<<(poVar4,(string *)
                               (pFVar5->comment).
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start);
      }
      std::operator<<(o,'\n');
      if (!bVar9) {
        local_70[0] = local_60;
        std::__cxx11::string::_M_construct((ulong)local_70,(char)pFVar5->blanks);
        std::operator<<(o,(string *)local_70);
        std::__cxx11::string::~string((string *)local_70);
        local_70[0] = local_60;
        std::__cxx11::string::_M_construct((ulong)local_70,(char)pFVar5->indent);
        std::operator<<(o,(string *)local_70);
        goto LAB_001a72a0;
      }
      goto LAB_001a72a8;
    }
    local_48 = local_48 + 1;
    pFVar5 = pFVar5 + 1;
  } while( true );
}

Assistant:

void fodder_fill(std::ostream &o, const Fodder &fodder, bool space_before, bool separate_token, bool final)
{
    unsigned last_indent = 0;
    size_t index = 0;
    for (const auto &fod : fodder) {
        bool skip_trailing = final && (index == (fodder.size() - 1));
        switch (fod.kind) {
            case FodderElement::LINE_END:
                if (fod.comment.size() > 0)
                    o << "  " << fod.comment[0];
                o << '\n';
                if (!skip_trailing) {
                    o << std::string(fod.blanks, '\n');
                    o << std::string(fod.indent, ' ');
                }
                last_indent = fod.indent;
                space_before = false;
                break;

            case FodderElement::INTERSTITIAL:
                if (space_before)
                    o << ' ';
                o << fod.comment[0];
                space_before = true;
                break;

            case FodderElement::PARAGRAPH: {
                bool first = true;
                for (const std::string &l : fod.comment) {
                    // Do not indent empty lines (note: first line is never empty).
                    if (l.length() > 0) {
                        // First line is already indented by previous fod.
                        if (!first)
                            o << std::string(last_indent, ' ');
                        o << l;
                    }
                    o << '\n';
                    first = false;
                }
                if (!skip_trailing) {
                    o << std::string(fod.blanks, '\n');
                    o << std::string(fod.indent, ' ');
                }
                last_indent = fod.indent;
                space_before = false;
            } break;
        }
        ++index;
    }
    if (separate_token && space_before)
        o << ' ';
}